

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_traits.cc
# Opt level: O2

void function_traits_on_lambda(void)

{
  bool bVar1;
  int iVar2;
  UnitTest *pUVar3;
  ostream *poVar4;
  undefined8 uVar5;
  allocator local_29;
  string local_28 [32];
  
  pUVar3 = UnitTest::getInstance();
  iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
  if ((char)iVar2 == '\0') {
    pUVar3 = UnitTest::getInstance();
    std::__cxx11::string::string
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
               ,&local_29);
    std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
    std::__cxx11::string::~string(local_28);
    pUVar3 = UnitTest::getInstance();
    pUVar3->last_checked_line_ = 0x2b;
    pUVar3 = UnitTest::getInstance();
    iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
    if ((char)iVar2 == '\0') {
      pUVar3 = UnitTest::getInstance();
      std::__cxx11::string::string
                (local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                 ,&local_29);
      std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
      std::__cxx11::string::~string(local_28);
      pUVar3 = UnitTest::getInstance();
      pUVar3->last_checked_line_ = 0x2c;
      bVar1 = std::type_info::operator==
                        ((type_info *)&int(bool,char,int)::typeinfo,
                         (type_info *)&int(bool,char,int)::typeinfo);
      if (!bVar1) {
        pUVar3 = UnitTest::getInstance();
        pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
        poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
        poVar4 = std::operator<<(poVar4,
                                 "typeid(function_traits<decltype(lambda)>::function_type) == typeid(int(bool, char, int))"
                                );
        poVar4 = std::operator<<(poVar4,"\" failed.");
        poVar4 = std::operator<<(poVar4,"at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2c);
        poVar4 = std::operator<<(poVar4,")");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      pUVar3 = UnitTest::getInstance();
      iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
      if ((char)iVar2 == '\0') {
        pUVar3 = UnitTest::getInstance();
        std::__cxx11::string::string
                  (local_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                   ,&local_29);
        std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
        std::__cxx11::string::~string(local_28);
        pUVar3 = UnitTest::getInstance();
        pUVar3->last_checked_line_ = 0x2d;
        bVar1 = std::type_info::operator==((type_info *)&int::typeinfo,(type_info *)&int::typeinfo);
        if (!bVar1) {
          pUVar3 = UnitTest::getInstance();
          pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
          poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
          poVar4 = std::operator<<(poVar4,
                                   "typeid(function_traits<decltype(lambda)>::return_type) == typeid(int)"
                                  );
          poVar4 = std::operator<<(poVar4,"\" failed.");
          poVar4 = std::operator<<(poVar4,"at ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                  );
          poVar4 = std::operator<<(poVar4,"(");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d);
          poVar4 = std::operator<<(poVar4,")");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        pUVar3 = UnitTest::getInstance();
        iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
        if ((char)iVar2 == '\0') {
          pUVar3 = UnitTest::getInstance();
          std::__cxx11::string::string
                    (local_28,
                     "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                     ,&local_29);
          std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
          std::__cxx11::string::~string(local_28);
          pUVar3 = UnitTest::getInstance();
          pUVar3->last_checked_line_ = 0x2e;
          bVar1 = std::type_info::operator==
                            ((type_info *)&std::function<int(bool,char,int)>::typeinfo,
                             (type_info *)&std::function<int(bool,char,int)>::typeinfo);
          if (!bVar1) {
            pUVar3 = UnitTest::getInstance();
            pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
            poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
            poVar4 = std::operator<<(poVar4,
                                     "typeid(function_traits<decltype(lambda)>::stl_function_type) == typeid(std::function<int(bool, char, int)>)"
                                    );
            poVar4 = std::operator<<(poVar4,"\" failed.");
            poVar4 = std::operator<<(poVar4,"at ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                    );
            poVar4 = std::operator<<(poVar4,"(");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
            poVar4 = std::operator<<(poVar4,")");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          pUVar3 = UnitTest::getInstance();
          iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
          if ((char)iVar2 == '\0') {
            pUVar3 = UnitTest::getInstance();
            std::__cxx11::string::string
                      (local_28,
                       "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                       ,&local_29);
            std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
            std::__cxx11::string::~string(local_28);
            pUVar3 = UnitTest::getInstance();
            pUVar3->last_checked_line_ = 0x2f;
            bVar1 = std::type_info::operator==
                              ((type_info *)&(*)(bool,char,int)::typeinfo,
                               (type_info *)&(*)(bool,char,int)::typeinfo);
            if (!bVar1) {
              pUVar3 = UnitTest::getInstance();
              pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
              poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
              poVar4 = std::operator<<(poVar4,
                                       "typeid(function_traits<decltype(lambda)>::pointer) == typeid(int(*)(bool, char, int))"
                                      );
              poVar4 = std::operator<<(poVar4,"\" failed.");
              poVar4 = std::operator<<(poVar4,"at ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                      );
              poVar4 = std::operator<<(poVar4,"(");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f);
              poVar4 = std::operator<<(poVar4,")");
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            pUVar3 = UnitTest::getInstance();
            iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
            if ((char)iVar2 == '\0') {
              pUVar3 = UnitTest::getInstance();
              std::__cxx11::string::string
                        (local_28,
                         "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                         ,&local_29);
              std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
              std::__cxx11::string::~string(local_28);
              pUVar3 = UnitTest::getInstance();
              pUVar3->last_checked_line_ = 0x30;
              bVar1 = std::type_info::operator==
                                ((type_info *)&bool::typeinfo,(type_info *)&bool::typeinfo);
              if (!bVar1) {
                pUVar3 = UnitTest::getInstance();
                pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
                poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
                poVar4 = std::operator<<(poVar4,
                                         "typeid(function_traits<decltype(lambda)>::args<0>::type) == typeid(bool)"
                                        );
                poVar4 = std::operator<<(poVar4,"\" failed.");
                poVar4 = std::operator<<(poVar4,"at ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                        );
                poVar4 = std::operator<<(poVar4,"(");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
                poVar4 = std::operator<<(poVar4,")");
                std::endl<char,std::char_traits<char>>(poVar4);
              }
              pUVar3 = UnitTest::getInstance();
              iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
              if ((char)iVar2 == '\0') {
                pUVar3 = UnitTest::getInstance();
                std::__cxx11::string::string
                          (local_28,
                           "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                           ,&local_29);
                std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
                std::__cxx11::string::~string(local_28);
                pUVar3 = UnitTest::getInstance();
                pUVar3->last_checked_line_ = 0x31;
                bVar1 = std::type_info::operator==
                                  ((type_info *)&char::typeinfo,(type_info *)&char::typeinfo);
                if (!bVar1) {
                  pUVar3 = UnitTest::getInstance();
                  pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
                  poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
                  poVar4 = std::operator<<(poVar4,
                                           "typeid(function_traits<decltype(lambda)>::args<1>::type) == typeid(char)"
                                          );
                  poVar4 = std::operator<<(poVar4,"\" failed.");
                  poVar4 = std::operator<<(poVar4,"at ");
                  poVar4 = std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                          );
                  poVar4 = std::operator<<(poVar4,"(");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x31);
                  poVar4 = std::operator<<(poVar4,")");
                  std::endl<char,std::char_traits<char>>(poVar4);
                }
                pUVar3 = UnitTest::getInstance();
                iVar2 = (*pUVar3->current_case_->_vptr_BaseCase[2])();
                if ((char)iVar2 == '\0') {
                  pUVar3 = UnitTest::getInstance();
                  std::__cxx11::string::string
                            (local_28,
                             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                             ,&local_29);
                  std::__cxx11::string::_M_assign((string *)&pUVar3->last_checked_file_);
                  std::__cxx11::string::~string(local_28);
                  pUVar3 = UnitTest::getInstance();
                  pUVar3->last_checked_line_ = 0x32;
                  bVar1 = std::type_info::operator==
                                    ((type_info *)&int::typeinfo,(type_info *)&int::typeinfo);
                  if (!bVar1) {
                    pUVar3 = UnitTest::getInstance();
                    pUVar3->failure_num_ = pUVar3->failure_num_ + 1;
                    poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
                    poVar4 = std::operator<<(poVar4,
                                             "typeid(function_traits<decltype(lambda)>::args<2>::type) == typeid(int)"
                                            );
                    poVar4 = std::operator<<(poVar4,"\" failed.");
                    poVar4 = std::operator<<(poVar4,"at ");
                    poVar4 = std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                            );
                    poVar4 = std::operator<<(poVar4,"(");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x32);
                    poVar4 = std::operator<<(poVar4,")");
                    std::endl<char,std::char_traits<char>>(poVar4);
                  }
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(function_traits_on_lambda)
{
    auto lambda = [](bool, char, int) { return 0; };
    TEST_CHECK(function_traits<decltype(lambda)>::arity == 3);
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::function_type) == typeid(int(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::return_type) == typeid(int));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::stl_function_type) == typeid(std::function<int(bool, char, int)>));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::pointer) == typeid(int(*)(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<0>::type) == typeid(bool));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<1>::type) == typeid(char));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<2>::type) == typeid(int));
}